

Human: Reconstruct the original C/C++ source from this Ghidra decompilation:

# cmTargetPropertyComputer.cxx
# Opt level: O1

bool cmTargetPropertyComputer::PassesWhitelist
               (TargetType tgtType,string *prop,cmMessenger *messenger,cmListFileBacktrace *context)

{
  bool bVar1;
  ostream *poVar2;
  bool bVar3;
  ostringstream e;
  string local_1c0;
  undefined1 local_1a0 [376];
  
  bVar3 = true;
  if (tgtType == INTERFACE_LIBRARY) {
    bVar1 = WhiteListedInterfaceProperty(prop);
    if (!bVar1) {
      std::__cxx11::ostringstream::ostringstream((ostringstream *)local_1a0);
      std::__ostream_insert<char,std::char_traits<char>>
                ((ostream *)local_1a0,
                 "INTERFACE_LIBRARY targets may only have whitelisted properties.  The property \"",
                 0x4f);
      poVar2 = std::__ostream_insert<char,std::char_traits<char>>
                         ((ostream *)local_1a0,(prop->_M_dataplus)._M_p,prop->_M_string_length);
      std::__ostream_insert<char,std::char_traits<char>>(poVar2,"\" is not allowed.",0x11);
      std::__cxx11::stringbuf::str();
      cmMessenger::IssueMessage(messenger,FATAL_ERROR,&local_1c0,context);
      if ((anon_union_16_2_edb7204a_for_basic_string<char,_std::char_traits<char>,_std::allocator<char>_>_11
           *)local_1c0._M_dataplus._M_p != &local_1c0.field_2) {
        operator_delete(local_1c0._M_dataplus._M_p,local_1c0.field_2._M_allocated_capacity + 1);
      }
      std::__cxx11::ostringstream::~ostringstream((ostringstream *)local_1a0);
      std::ios_base::~ios_base((ios_base *)(local_1a0 + 0x70));
      bVar3 = false;
    }
  }
  return bVar3;
}

Assistant:

bool cmTargetPropertyComputer::PassesWhitelist(
  cmStateEnums::TargetType tgtType, std::string const& prop,
  cmMessenger* messenger, cmListFileBacktrace const& context)
{
  if (tgtType == cmStateEnums::INTERFACE_LIBRARY &&
      !WhiteListedInterfaceProperty(prop)) {
    std::ostringstream e;
    e << "INTERFACE_LIBRARY targets may only have whitelisted properties.  "
         "The property \""
      << prop << "\" is not allowed.";
    messenger->IssueMessage(cmake::FATAL_ERROR, e.str(), context);
    return false;
  }
  return true;
}